

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

pair<double_*,_bool>
HighsHashTree<std::pair<int,_int>,_double>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,
          HighsHashTableEntry<std::pair<int,_int>,_double> *entry)

{
  int *piVar1;
  byte bVar2;
  double dVar3;
  int i;
  ValueType *pVVar5;
  uint uVar4;
  long lVar6;
  InnerLeaf<1> *pIVar7;
  undefined8 *puVar8;
  InnerLeaf<4> *this;
  u64 uVar9;
  sbyte sVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar11;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  ulong uVar12;
  undefined8 extraout_RDX_03;
  int i_1;
  int i_4;
  int iVar13;
  ulong uVar14;
  uint numChilds;
  long lVar15;
  ulong uVar16;
  long lVar17;
  Entry *pEVar18;
  int i_3;
  InnerLeaf<4> *this_00;
  BranchNode *pBVar19;
  int i_2;
  undefined8 *puVar20;
  undefined1 auVar21 [16];
  pair<double_*,_bool> pVar22;
  pair<double_*,_bool> pVar23;
  pair<double_*,_bool> pVar24;
  ulong uStack_b0;
  undefined4 local_6c;
  array<unsigned_char,_55UL> sizes;
  
  uVar16 = insertNode->ptrAndType;
  switch((uint)uVar16 & 7) {
  case 0:
    if (hashPos != 9) {
      pIVar7 = (InnerLeaf<1> *)operator_new(0xa8);
      InnerLeaf<1>::InnerLeaf(pIVar7);
      insertNode->ptrAndType = (ulong)pIVar7 | 2;
      pVar22 = InnerLeaf<1>::insert_entry(pIVar7,hash,hashPos,entry);
      return pVar22;
    }
    puVar8 = (undefined8 *)operator_new(0x20);
    *puVar8 = 0;
    dVar3 = entry->value_;
    *(pair<int,_int> *)(puVar8 + 1) = entry->key_;
    puVar8[2] = dVar3;
    *(undefined4 *)(puVar8 + 3) = 1;
    insertNode->ptrAndType = (ulong)puVar8 | 1;
    uVar11 = extraout_RDX;
    goto LAB_0031a47b;
  case 1:
    puVar8 = (undefined8 *)(uVar16 & 0xfffffffffffffff8);
    do {
      puVar20 = puVar8;
      auVar21._0_4_ = -(uint)((int)puVar20[1] == (entry->key_).first);
      iVar13 = -(uint)((int)((ulong)puVar20[1] >> 0x20) == (entry->key_).second);
      auVar21._4_4_ = auVar21._0_4_;
      auVar21._8_4_ = iVar13;
      auVar21._12_4_ = iVar13;
      iVar13 = movmskpd((int)puVar20,auVar21);
      if (iVar13 == 3) {
        uVar11 = 0;
        goto LAB_0031a595;
      }
      puVar8 = (undefined8 *)*puVar20;
    } while ((undefined8 *)*puVar20 != (undefined8 *)0x0);
    puVar8 = (undefined8 *)operator_new(0x18);
    *puVar8 = 0;
    dVar3 = entry->value_;
    *(pair<int,_int> *)(puVar8 + 1) = entry->key_;
    puVar8[2] = dVar3;
    *puVar20 = puVar8;
    piVar1 = (int *)((undefined8 *)(uVar16 & 0xfffffffffffffff8) + 3);
    *piVar1 = *piVar1 + 1;
    uVar11 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
    puVar20 = puVar8;
LAB_0031a595:
    pVar23._8_8_ = uVar11;
    pVar23.first = (double *)(puVar20 + 2);
    break;
  case 2:
    pVar23 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar16 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar23 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar16 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar23 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar16 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar16 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar22 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      return pVar22;
    }
    pVVar5 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->key_);
    if (pVVar5 != (ValueType *)0x0) {
      pVar22._8_8_ = 0;
      pVar22.first = pVVar5;
      return pVar22;
    }
    uVar4 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
    uVar16 = (this_00->occupation).occupation | 1L << (ulong)uVar4;
    lVar15 = POPCOUNT(uVar16);
    numChilds = (uint)lVar15;
    pBVar19 = createBranchingNode(numChilds);
    insertNode->ptrAndType = (ulong)pBVar19 | 6;
    (pBVar19->occupation).occupation = uVar16;
    iVar13 = hashPos + 1;
    sVar10 = (sbyte)uVar4;
    if (iVar13 != 9) {
      if (numChilds < 2) {
        insertNode = pBVar19->child;
        pBVar19->child[0].ptrAndType = (ulong)this_00 | 5;
        InnerLeaf<4>::rehash(this_00,iVar13);
      }
      else {
        uVar4 = this_00->size;
        local_6c = (uVar4 - numChilds) + 2;
        if (local_6c < 7) {
          for (lVar6 = 0; lVar15 != lVar6; lVar6 = lVar6 + 1) {
            pIVar7 = (InnerLeaf<1> *)operator_new(0xa8);
            InnerLeaf<1>::InnerLeaf(pIVar7);
            pBVar19->child[lVar6].ptrAndType = (ulong)pIVar7 | 2;
          }
          pEVar18 = (this_00->entries)._M_elems;
          for (lVar15 = 0; lVar15 < this_00->size; lVar15 = lVar15 + 1) {
            uVar14 = pBVar19->child
                     [POPCOUNT(uVar16 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar15] >> 10) &
                                         0x3f)) + -1].ptrAndType;
            uVar9 = HighsHashHelpers::hash<std::pair<int,_int>,_0>(&pEVar18->key_);
            InnerLeaf<1>::insert_entry
                      ((InnerLeaf<1> *)(uVar14 & 0xfffffffffffffff8),uVar9,iVar13,pEVar18);
            pEVar18 = pEVar18 + 1;
          }
          operator_delete(this_00);
          pVar24 = InnerLeaf<1>::insert_entry
                             ((InnerLeaf<1> *)
                              (pBVar19->child[POPCOUNT(uVar16 >> sVar10) + -1].ptrAndType &
                              0xfffffffffffffff8),hash,iVar13,entry);
          iVar13 = hashPos;
        }
        else {
          sizes._M_elems._32_15_ = SUB1615((undefined1  [16])0x0,0);
          sizes._M_elems[0x10] = '\0';
          sizes._M_elems[0x11] = '\0';
          sizes._M_elems[0x12] = '\0';
          sizes._M_elems[0x13] = '\0';
          sizes._M_elems[0x14] = '\0';
          sizes._M_elems[0x15] = '\0';
          sizes._M_elems[0x16] = '\0';
          sizes._M_elems[0x17] = '\0';
          sizes._M_elems[0x18] = '\0';
          sizes._M_elems[0x19] = '\0';
          sizes._M_elems[0x1a] = '\0';
          sizes._M_elems[0x1b] = '\0';
          sizes._M_elems[0x1c] = '\0';
          sizes._M_elems[0x1d] = '\0';
          sizes._M_elems[0x1e] = '\0';
          sizes._M_elems[0x1f] = '\0';
          sizes._M_elems[0] = '\0';
          sizes._M_elems[1] = '\0';
          sizes._M_elems[2] = '\0';
          sizes._M_elems[3] = '\0';
          sizes._M_elems[4] = '\0';
          sizes._M_elems[5] = '\0';
          sizes._M_elems[6] = '\0';
          sizes._M_elems[7] = '\0';
          sizes._M_elems[8] = '\0';
          sizes._M_elems[9] = '\0';
          sizes._M_elems[10] = '\0';
          sizes._M_elems[0xb] = '\0';
          sizes._M_elems[0xc] = '\0';
          sizes._M_elems[0xd] = '\0';
          sizes._M_elems[0xe] = '\0';
          sizes._M_elems[0xf] = '\0';
          sizes._M_elems[0x2f] = '\0';
          sizes._M_elems[0x30] = '\0';
          sizes._M_elems[0x31] = '\0';
          sizes._M_elems[0x32] = '\0';
          sizes._M_elems[0x33] = '\0';
          sizes._M_elems[0x34] = '\0';
          sizes._M_elems[0x35] = '\0';
          sizes._M_elems[0x36] = '\0';
          sizes._M_elems[POPCOUNT(uVar16 >> sVar10) + -1] =
               sizes._M_elems[POPCOUNT(uVar16 >> sVar10) + -1] + '\x01';
          uVar12 = 0;
          uVar14 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar14 = uVar12;
          }
          for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
            sizes._M_elems
            [POPCOUNT(uVar16 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar12] >> 10) & 0x3f)) +
             -1] = sizes._M_elems
                   [POPCOUNT(uVar16 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar12] >> 10) &
                                       0x3f)) + -1] + '\x01';
          }
          for (lVar6 = 0; lVar15 != lVar6; lVar6 = lVar6 + 1) {
            switch(sizes._M_elems[lVar6] + 9 >> 4) {
            case 0:
              this = (InnerLeaf<4> *)operator_new(0xa8);
              InnerLeaf<1>::InnerLeaf((InnerLeaf<1> *)this);
              uStack_b0 = 2;
              break;
            case 1:
              this = (InnerLeaf<4> *)operator_new(0x228);
              InnerLeaf<2>::InnerLeaf((InnerLeaf<2> *)this);
              uStack_b0 = 3;
              break;
            case 2:
              this = (InnerLeaf<4> *)operator_new(0x3a8);
              InnerLeaf<3>::InnerLeaf((InnerLeaf<3> *)this);
              uStack_b0 = 4;
              break;
            case 3:
              this = (InnerLeaf<4> *)operator_new(0x528);
              InnerLeaf<4>::InnerLeaf(this);
              uStack_b0 = 5;
              break;
            default:
              goto switchD_0031a939_default;
            }
            pBVar19->child[lVar6].ptrAndType = (ulong)this | uStack_b0;
switchD_0031a939_default:
          }
          pEVar18 = (this_00->entries)._M_elems;
          for (lVar15 = 0; lVar15 < this_00->size; lVar15 = lVar15 + 1) {
            uVar14 = pBVar19->child
                     [POPCOUNT(uVar16 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar15] >> 10) &
                                         0x3f)) + -1].ptrAndType;
            switch((uint)uVar14 & 7) {
            case 2:
              uVar9 = HighsHashHelpers::hash<std::pair<int,_int>,_0>(&pEVar18->key_);
              InnerLeaf<1>::insert_entry
                        ((InnerLeaf<1> *)(uVar14 & 0xfffffffffffffff8),uVar9,iVar13,pEVar18);
              break;
            case 3:
              uVar9 = HighsHashHelpers::hash<std::pair<int,_int>,_0>(&pEVar18->key_);
              InnerLeaf<2>::insert_entry
                        ((InnerLeaf<2> *)(uVar14 & 0xfffffffffffffff8),uVar9,iVar13,pEVar18);
              break;
            case 4:
              uVar9 = HighsHashHelpers::hash<std::pair<int,_int>,_0>(&pEVar18->key_);
              InnerLeaf<3>::insert_entry
                        ((InnerLeaf<3> *)(uVar14 & 0xfffffffffffffff8),uVar9,iVar13,pEVar18);
              break;
            case 5:
              uVar9 = HighsHashHelpers::hash<std::pair<int,_int>,_0>(&pEVar18->key_);
              InnerLeaf<4>::insert_entry
                        ((InnerLeaf<4> *)(uVar14 & 0xfffffffffffffff8),uVar9,iVar13,pEVar18);
            }
            pEVar18 = pEVar18 + 1;
          }
          operator_delete(this_00);
          pVar24._8_8_ = extraout_RDX_03;
          pVar24.first = (double *)pEVar18;
          insertNode = pBVar19->child + POPCOUNT(uVar16 >> sVar10) + -1;
        }
        if (local_6c < 7) {
          return pVar24;
        }
      }
      goto LAB_0031a622;
    }
    for (lVar6 = 0; lVar15 != lVar6; lVar6 = lVar6 + 1) {
      pBVar19->child[lVar6].ptrAndType = 0;
    }
    iVar13 = this_00->size;
    lVar6 = 0x1c8;
    for (lVar15 = 0; lVar15 < iVar13; lVar15 = lVar15 + 1) {
      lVar17 = POPCOUNT(uVar16 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar15] >> 10) & 0x3f));
      uVar14 = pBVar19->child[lVar17 + -1].ptrAndType;
      if ((uVar14 & 7) == 0) {
        puVar20 = (undefined8 *)operator_new(0x20);
        *puVar20 = 0;
        puVar8 = (undefined8 *)((long)(this_00->hashes)._M_elems + lVar6 + -0x10);
        uVar11 = puVar8[1];
        puVar20[1] = *puVar8;
        puVar20[2] = uVar11;
        *(undefined4 *)(puVar20 + 3) = 1;
        pBVar19->child[lVar17 + -1].ptrAndType = (ulong)puVar20 | 1;
      }
      else {
        puVar20 = (undefined8 *)(uVar14 & 0xfffffffffffffff8);
        puVar8 = (undefined8 *)operator_new(0x18);
        puVar8[2] = puVar20[2];
        uVar11 = puVar20[1];
        *puVar8 = *puVar20;
        puVar8[1] = uVar11;
        *puVar20 = puVar8;
        *(undefined4 *)(puVar20 + 1) =
             *(undefined4 *)((long)(this_00->hashes)._M_elems + lVar6 + -0x10);
        *(undefined4 *)((long)puVar20 + 0xc) =
             *(undefined4 *)((long)(this_00->hashes)._M_elems + lVar6 + -0xc);
        puVar20[2] = *(undefined8 *)((long)(this_00->hashes)._M_elems + lVar6 + -8);
        *(int *)(puVar20 + 3) = *(int *)(puVar20 + 3) + 1;
      }
      lVar6 = lVar6 + 0x10;
    }
    operator_delete(this_00);
    uVar14 = pBVar19->child[POPCOUNT(uVar16 >> sVar10) + -1].ptrAndType;
    if ((uVar14 & 7) == 0) {
      puVar8 = (undefined8 *)operator_new(0x20);
      *puVar8 = 0;
      dVar3 = entry->value_;
      *(pair<int,_int> *)(puVar8 + 1) = entry->key_;
      puVar8[2] = dVar3;
      *(undefined4 *)(puVar8 + 3) = 1;
      pBVar19->child[POPCOUNT(uVar16 >> sVar10) + -1].ptrAndType = (ulong)puVar8 | 1;
      uVar11 = extraout_RDX_02;
    }
    else {
      puVar8 = (undefined8 *)(uVar14 & 0xfffffffffffffff8);
      puVar20 = (undefined8 *)operator_new(0x18);
      puVar20[2] = puVar8[2];
      uVar11 = puVar8[1];
      *puVar20 = *puVar8;
      puVar20[1] = uVar11;
      *puVar8 = puVar20;
      *(int *)(puVar8 + 1) = (entry->key_).first;
      *(int *)((long)puVar8 + 0xc) = (entry->key_).second;
      puVar8[2] = entry->value_;
      *(int *)(puVar8 + 3) = *(int *)(puVar8 + 3) + 1;
      uVar11 = extraout_RDX_01;
    }
LAB_0031a47b:
    pVar23._9_7_ = (int7)((ulong)uVar11 >> 8);
    pVar23.second = true;
    pVar23.first = (double *)(puVar8 + 2);
    break;
  case 6:
    uVar14 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    pBVar19 = (BranchNode *)(uVar16 & 0xfffffffffffffff8);
    uVar16 = (pBVar19->occupation).occupation;
    bVar2 = (byte)uVar14;
    lVar15 = POPCOUNT(uVar16 >> (bVar2 & 0x3f));
    if ((uVar16 >> (uVar14 & 0x3f) & 1) == 0) {
      pBVar19 = addChildToBranchNode(pBVar19,bVar2 & 0x3f,(int)lVar15);
      pBVar19->child[lVar15].ptrAndType = 0;
      (pBVar19->occupation).occupation = (pBVar19->occupation).occupation | 1L << (bVar2 & 0x3f);
    }
    else {
      lVar15 = lVar15 + -1;
    }
    insertNode->ptrAndType = (ulong)pBVar19 | 6;
    iVar13 = hashPos + 1;
    insertNode = pBVar19->child + lVar15;
    goto LAB_0031a622;
  case 7:
    iVar13 = hashPos;
LAB_0031a622:
    pVar23 = insert_recurse(insertNode,hash,iVar13,entry);
  }
  return pVar23;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }